

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall
anon_unknown.dwarf_4402ef::ParameterPack::getSyntaxNode(ParameterPack *this,OutputStream *S)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  if (S->CurrentPackMax == 0xffffffff) {
    uVar3 = (this->Data).NumElements;
    S->CurrentPackMax = (uint)uVar3;
    S->CurrentPackIndex = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)S->CurrentPackIndex;
    uVar3 = (this->Data).NumElements;
  }
  if (uVar2 < uVar3) {
    iVar1 = (*(this->Data).Elements[uVar2]->_vptr_Node[3])();
    return (Node *)CONCAT44(extraout_var,iVar1);
  }
  return &this->super_Node;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }